

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AIS.h
# Opt level: O3

int decode_AIS(char *aisbuf,int aisbuflen,double *pAIS_Latitude,double *pAIS_Longitude,
              double *pAIS_SOG,double *pAIS_COG)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long *plVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  string temp_s;
  string ais_position_accuracy;
  string ais_binary;
  bitset<27UL> ii;
  bitset<28UL> hh;
  string six_bit;
  string six_bit_table [120];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1138;
  long *local_1118;
  long local_1110;
  long local_1108 [2];
  long *local_10f8 [2];
  long local_10e8 [2];
  ulong local_10d8;
  ulong local_10d0;
  long *local_10c8 [2];
  long local_10b8 [2];
  double local_10a8;
  double dStack_10a0;
  double local_1098;
  double dStack_1090;
  ulong local_1088;
  ulong local_1080;
  double *local_1078;
  double *local_1070;
  double *local_1068;
  double *local_1060;
  long *local_1058;
  ulong local_1050;
  long local_1048 [2];
  long *local_1038;
  uint local_1030;
  long local_1028 [2];
  long *local_1018;
  uint local_1010;
  long local_1008 [2];
  long *local_ff8;
  uint local_ff0;
  long local_fe8 [2];
  long *local_fd8;
  uint local_fd0;
  long local_fc8 [2];
  long *local_fb8;
  uint local_fb0;
  long local_fa8 [2];
  long *local_f98;
  uint local_f90;
  long local_f88 [2];
  long *local_f78;
  uint local_f70;
  long local_f68 [2];
  long *local_f58;
  uint local_f50;
  long local_f48 [2];
  ulong local_f38 [2];
  undefined1 local_f28 [1528];
  char *local_930;
  undefined1 local_918 [8];
  char *local_910;
  undefined1 local_8f8 [8];
  char *local_8f0;
  undefined1 local_8d8 [8];
  char *local_8d0;
  undefined1 local_8b8 [8];
  char *local_8b0;
  undefined1 local_898 [8];
  char *local_890;
  undefined1 local_878 [8];
  char *local_870;
  undefined1 local_858 [8];
  char *local_850;
  undefined1 local_838 [8];
  char *local_830;
  undefined1 local_818 [8];
  char *local_810;
  undefined1 local_7f8 [8];
  char *local_7f0;
  undefined1 local_7d8 [8];
  char *local_7d0;
  undefined1 local_7b8 [8];
  char *local_7b0;
  undefined1 local_798 [8];
  char *local_790;
  undefined1 local_778 [8];
  char *local_770;
  undefined1 local_758 [8];
  char *local_750;
  undefined1 local_738 [8];
  char *local_730;
  undefined1 local_718 [8];
  char *local_710;
  undefined1 local_6f8 [8];
  char *local_6f0;
  undefined1 local_6d8 [8];
  char *local_6d0;
  undefined1 local_6b8 [8];
  char *local_6b0;
  undefined1 local_698 [8];
  char *local_690;
  undefined1 local_678 [8];
  char *local_670;
  undefined1 local_658 [8];
  char *local_650;
  undefined1 local_638 [8];
  char *local_630;
  undefined1 local_618 [8];
  char *local_610;
  undefined1 local_5f8 [8];
  char *local_5f0;
  undefined1 local_5d8 [8];
  char *local_5d0;
  undefined1 local_5b8 [8];
  char *local_5b0;
  undefined1 local_598 [8];
  char *local_590;
  undefined1 local_578 [8];
  char *local_570;
  undefined1 local_558 [8];
  char *local_550;
  undefined1 local_538 [8];
  char *local_530;
  undefined1 local_518 [8];
  char *local_510;
  undefined1 local_4f8 [8];
  char *local_4f0;
  undefined1 local_4d8 [8];
  char *local_4d0;
  undefined1 local_4b8 [8];
  char *local_4b0;
  undefined1 local_498 [8];
  char *local_490;
  undefined1 local_478 [8];
  char *local_470;
  undefined1 local_458 [8];
  char *local_450;
  undefined1 local_338 [8];
  char *local_330;
  undefined1 local_318 [8];
  char *local_310;
  undefined1 local_2f8 [8];
  char *local_2f0;
  undefined1 local_2d8 [8];
  char *local_2d0;
  undefined1 local_2b8 [8];
  char *local_2b0;
  undefined1 local_298 [8];
  char *local_290;
  undefined1 local_278 [8];
  char *local_270;
  undefined1 local_258 [8];
  char *local_250;
  undefined1 local_238 [8];
  char *local_230;
  undefined1 local_218 [8];
  char *local_210;
  undefined1 local_1f8 [8];
  char *local_1f0;
  undefined1 local_1d8 [8];
  char *local_1d0;
  undefined1 local_1b8 [8];
  char *local_1b0;
  undefined1 local_198 [8];
  char *local_190;
  undefined1 local_178 [8];
  char *local_170;
  undefined1 local_158 [8];
  char *local_150;
  undefined1 local_138 [8];
  char *local_130;
  undefined1 local_118 [8];
  char *local_110;
  undefined1 local_f8 [8];
  char *local_f0;
  undefined1 local_d8 [8];
  char *local_d0;
  undefined1 local_b8 [8];
  char *local_b0;
  undefined1 local_98 [8];
  char *local_90;
  undefined1 local_78 [8];
  char *local_70;
  long local_58;
  char *local_50;
  long local_48 [3];
  
  lVar3 = 0x10;
  do {
    *(undefined1 **)((long)local_f48 + lVar3) = (undefined1 *)((long)local_f38 + lVar3);
    *(undefined8 *)((long)local_f48 + lVar3 + 8) = 0;
    *(undefined1 *)((long)local_f38 + lVar3) = 0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0xf10);
  local_1078 = pAIS_Latitude;
  local_1070 = pAIS_Longitude;
  local_1068 = pAIS_SOG;
  local_1060 = pAIS_COG;
  std::__cxx11::string::_M_replace((ulong)(local_f28 + 0x5f0),0,local_930,0x1de5b5);
  std::__cxx11::string::_M_replace((ulong)local_918,0,local_910,0x1ccc81);
  std::__cxx11::string::_M_replace((ulong)local_8f8,0,local_8f0,0x1ccc88);
  std::__cxx11::string::_M_replace((ulong)local_8d8,0,local_8d0,0x1ccc8f);
  std::__cxx11::string::_M_replace((ulong)local_8b8,0,local_8b0,0x1ccc96);
  std::__cxx11::string::_M_replace((ulong)local_898,0,local_890,0x1ccc9d);
  std::__cxx11::string::_M_replace((ulong)local_878,0,local_870,0x1ccca4);
  std::__cxx11::string::_M_replace((ulong)local_858,0,local_850,0x1cccab);
  std::__cxx11::string::_M_replace((ulong)local_838,0,local_830,0x1cccb2);
  std::__cxx11::string::_M_replace((ulong)local_818,0,local_810,0x1cccb9);
  std::__cxx11::string::_M_replace((ulong)local_7f8,0,local_7f0,0x1cccc0);
  std::__cxx11::string::_M_replace((ulong)local_7d8,0,local_7d0,0x1cccc7);
  std::__cxx11::string::_M_replace((ulong)local_7b8,0,local_7b0,0x1cccce);
  std::__cxx11::string::_M_replace((ulong)local_798,0,local_790,0x1cccd5);
  std::__cxx11::string::_M_replace((ulong)local_778,0,local_770,0x1cccdc);
  std::__cxx11::string::_M_replace((ulong)local_758,0,local_750,0x1ccce3);
  std::__cxx11::string::_M_replace((ulong)local_738,0,local_730,0x1cccea);
  std::__cxx11::string::_M_replace((ulong)local_718,0,local_710,0x1cccf1);
  std::__cxx11::string::_M_replace((ulong)local_6f8,0,local_6f0,0x1cccf8);
  std::__cxx11::string::_M_replace((ulong)local_6d8,0,local_6d0,0x1cccff);
  std::__cxx11::string::_M_replace((ulong)local_6b8,0,local_6b0,0x1ccd06);
  std::__cxx11::string::_M_replace((ulong)local_698,0,local_690,0x1ccd0d);
  std::__cxx11::string::_M_replace((ulong)local_678,0,local_670,0x1ccd14);
  std::__cxx11::string::_M_replace((ulong)local_658,0,local_650,0x1ccd1b);
  std::__cxx11::string::_M_replace((ulong)local_638,0,local_630,0x1ccd22);
  std::__cxx11::string::_M_replace((ulong)local_618,0,local_610,0x1ccd29);
  std::__cxx11::string::_M_replace((ulong)local_5f8,0,local_5f0,0x1ccd30);
  std::__cxx11::string::_M_replace((ulong)local_5d8,0,local_5d0,0x1ccd37);
  std::__cxx11::string::_M_replace((ulong)local_5b8,0,local_5b0,0x1ccd3e);
  std::__cxx11::string::_M_replace((ulong)local_598,0,local_590,0x1ccd45);
  std::__cxx11::string::_M_replace((ulong)local_578,0,local_570,0x1ccd4c);
  std::__cxx11::string::_M_replace((ulong)local_558,0,local_550,0x1ccd53);
  std::__cxx11::string::_M_replace((ulong)local_538,0,local_530,0x1ccd5a);
  std::__cxx11::string::_M_replace((ulong)local_518,0,local_510,0x1ccd61);
  std::__cxx11::string::_M_replace((ulong)local_4f8,0,local_4f0,0x1ccd68);
  std::__cxx11::string::_M_replace((ulong)local_4d8,0,local_4d0,0x1ccd6f);
  std::__cxx11::string::_M_replace((ulong)local_4b8,0,local_4b0,0x1ccd76);
  std::__cxx11::string::_M_replace((ulong)local_498,0,local_490,0x1ccd7d);
  std::__cxx11::string::_M_replace((ulong)local_478,0,local_470,0x1ccd84);
  std::__cxx11::string::_M_replace((ulong)local_458,0,local_450,0x1ccd8b);
  std::__cxx11::string::_M_replace((ulong)local_338,0,local_330,0x1ccd92);
  std::__cxx11::string::_M_replace((ulong)local_318,0,local_310,0x1ccd99);
  std::__cxx11::string::_M_replace((ulong)local_2f8,0,local_2f0,0x1ccda0);
  std::__cxx11::string::_M_replace((ulong)local_2d8,0,local_2d0,0x1ccda7);
  std::__cxx11::string::_M_replace((ulong)local_2b8,0,local_2b0,0x1ccdae);
  std::__cxx11::string::_M_replace((ulong)local_298,0,local_290,0x1ccdb5);
  std::__cxx11::string::_M_replace((ulong)local_278,0,local_270,0x1ccdbc);
  std::__cxx11::string::_M_replace((ulong)local_258,0,local_250,0x1ccdc3);
  std::__cxx11::string::_M_replace((ulong)local_238,0,local_230,0x1ccdca);
  std::__cxx11::string::_M_replace((ulong)local_218,0,local_210,0x1ccdd1);
  std::__cxx11::string::_M_replace((ulong)local_1f8,0,local_1f0,0x1ccdd8);
  std::__cxx11::string::_M_replace((ulong)local_1d8,0,local_1d0,0x1ccddf);
  std::__cxx11::string::_M_replace((ulong)local_1b8,0,local_1b0,0x1ccde6);
  std::__cxx11::string::_M_replace((ulong)local_198,0,local_190,0x1ccded);
  std::__cxx11::string::_M_replace((ulong)local_178,0,local_170,0x1ccdf4);
  std::__cxx11::string::_M_replace((ulong)local_158,0,local_150,0x1ccdfb);
  std::__cxx11::string::_M_replace((ulong)local_138,0,local_130,0x1cce02);
  std::__cxx11::string::_M_replace((ulong)local_118,0,local_110,0x1cce09);
  std::__cxx11::string::_M_replace((ulong)local_f8,0,local_f0,0x1cce10);
  std::__cxx11::string::_M_replace((ulong)local_d8,0,local_d0,0x1cce17);
  std::__cxx11::string::_M_replace((ulong)local_b8,0,local_b0,0x1cce1e);
  std::__cxx11::string::_M_replace((ulong)local_98,0,local_90,0x1cce25);
  std::__cxx11::string::_M_replace((ulong)local_78,0,local_70,0x1cce2c);
  std::__cxx11::string::_M_replace((ulong)&local_58,0,local_50,0x1cce33);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1058,aisbuf,(allocator<char> *)local_10f8);
  local_10f8[0] = local_10e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10f8,"");
  if (local_1050 != 0) {
    uVar4 = 0;
    uVar7 = 1;
    do {
      std::__cxx11::string::_M_append
                ((char *)local_10f8,local_f38[(long)*(char *)((long)local_1058 + uVar4) * 4]);
      bVar1 = uVar7 < local_1050;
      uVar4 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar1);
  }
  std::__cxx11::string::substr((ulong)&local_1138,(ulong)local_10f8);
  local_f58 = local_f48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f58,local_1138._M_dataplus._M_p,
             local_1138._M_dataplus._M_p + local_1138._M_string_length);
  if ((int)local_f50 < 1) {
    iVar10 = 0;
  }
  else {
    uVar2 = local_f50 & 0x7fffffff;
    uVar4 = 0;
    iVar10 = 0;
    do {
      local_f50 = local_f50 - 1;
      iVar10 = iVar10 + (*(char *)((long)local_f58 + uVar4) + -0x30 << ((byte)local_f50 & 0x1f));
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  if (local_f58 != local_f48) {
    operator_delete(local_f58,local_f48[0] + 1);
  }
  iVar6 = 1;
  if (0xfffffffc < iVar10 - 4U) {
    std::__cxx11::string::substr((ulong)&local_1118,(ulong)local_10f8);
    std::__cxx11::string::operator=((string *)&local_1138,(string *)&local_1118);
    if (local_1118 != local_1108) {
      operator_delete(local_1118,local_1108[0] + 1);
    }
    local_f78 = local_f68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f78,local_1138._M_dataplus._M_p,
               local_1138._M_dataplus._M_p + local_1138._M_string_length);
    if ((int)local_f70 < 1) {
      iVar6 = 0;
    }
    else {
      uVar2 = local_f70 & 0x7fffffff;
      uVar4 = 0;
      iVar6 = 0;
      do {
        local_f70 = local_f70 - 1;
        iVar6 = iVar6 + (*(char *)((long)local_f78 + uVar4) + -0x30 << ((byte)local_f70 & 0x1f));
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
    if (local_f78 != local_f68) {
      operator_delete(local_f78,local_f68[0] + 1);
    }
    std::__cxx11::string::substr((ulong)&local_1118,(ulong)local_10f8);
    std::__cxx11::string::operator=((string *)&local_1138,(string *)&local_1118);
    if (local_1118 != local_1108) {
      operator_delete(local_1118,local_1108[0] + 1);
    }
    local_f98 = local_f88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f98,local_1138._M_dataplus._M_p,
               local_1138._M_dataplus._M_p + local_1138._M_string_length);
    if ((int)local_f90 < 1) {
      iVar5 = 0;
    }
    else {
      uVar2 = local_f90 & 0x7fffffff;
      uVar4 = 0;
      iVar5 = 0;
      do {
        local_f90 = local_f90 - 1;
        iVar5 = iVar5 + (*(char *)((long)local_f98 + uVar4) + -0x30 << ((byte)local_f90 & 0x1f));
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
    if (local_f98 != local_f88) {
      operator_delete(local_f98,local_f88[0] + 1);
    }
    std::__cxx11::string::substr((ulong)&local_1118,(ulong)local_10f8);
    std::__cxx11::string::operator=((string *)&local_1138,(string *)&local_1118);
    if (local_1118 != local_1108) {
      operator_delete(local_1118,local_1108[0] + 1);
    }
    local_fb8 = local_fa8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_fb8,local_1138._M_dataplus._M_p,
               local_1138._M_dataplus._M_p + local_1138._M_string_length);
    if ((int)local_fb0 < 1) {
      iVar11 = 0;
    }
    else {
      uVar2 = local_fb0 & 0x7fffffff;
      uVar4 = 0;
      iVar11 = 0;
      do {
        local_fb0 = local_fb0 - 1;
        iVar11 = iVar11 + (*(char *)((long)local_fb8 + uVar4) + -0x30 << ((byte)local_fb0 & 0x1f));
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
    if (local_fb8 != local_fa8) {
      operator_delete(local_fb8,local_fa8[0] + 1);
    }
    std::__cxx11::string::substr((ulong)&local_1118,(ulong)local_10f8);
    std::__cxx11::string::operator=((string *)&local_1138,(string *)&local_1118);
    if (local_1118 != local_1108) {
      operator_delete(local_1118,local_1108[0] + 1);
    }
    local_fd8 = local_fc8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_fd8,local_1138._M_dataplus._M_p,
               local_1138._M_dataplus._M_p + local_1138._M_string_length);
    if ((int)local_fd0 < 1) {
      iVar9 = 0;
    }
    else {
      uVar2 = local_fd0 & 0x7fffffff;
      uVar4 = 0;
      iVar9 = 0;
      do {
        local_fd0 = local_fd0 - 1;
        iVar9 = iVar9 + (*(char *)((long)local_fd8 + uVar4) + -0x30 << ((byte)local_fd0 & 0x1f));
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
    if (local_fd8 != local_fc8) {
      operator_delete(local_fd8,local_fc8[0] + 1);
    }
    std::__cxx11::string::substr((ulong)&local_1118,(ulong)local_10f8);
    std::__cxx11::string::operator=((string *)&local_1138,(string *)&local_1118);
    if (local_1118 != local_1108) {
      operator_delete(local_1118,local_1108[0] + 1);
    }
    local_ff8 = local_fe8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_ff8,local_1138._M_dataplus._M_p,
               local_1138._M_dataplus._M_p + local_1138._M_string_length);
    if ((int)local_ff0 < 1) {
      local_10d0 = 0;
    }
    else {
      uVar2 = local_ff0 & 0x7fffffff;
      uVar4 = 0;
      iVar8 = 0;
      do {
        local_ff0 = local_ff0 - 1;
        iVar8 = iVar8 + (*(char *)((long)local_ff8 + uVar4) + -0x30 << ((byte)local_ff0 & 0x1f));
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
      local_10d0 = (ulong)(uint)(iVar8 / 10);
    }
    if (local_ff8 != local_fe8) {
      operator_delete(local_ff8,local_fe8[0] + 1);
    }
    std::__cxx11::string::substr((ulong)&local_1118,(ulong)local_10f8);
    local_1098 = (double)CONCAT71(local_1098._1_7_,*(undefined1 *)((long)local_10f8[0] + 0x3d));
    std::__cxx11::string::substr((ulong)local_10c8,(ulong)local_10f8);
    std::__cxx11::string::operator=((string *)&local_1138,(string *)local_10c8);
    if (local_10c8[0] != local_10b8) {
      operator_delete(local_10c8[0],local_10b8[0] + 1);
    }
    std::bitset<28ul>::bitset<char,std::char_traits<char>,std::allocator<char>>
              ((bitset<28ul> *)&local_1080,&local_1138,0);
    if (local_1098._0_1_ == '1') {
      local_1080 = (ulong)(~(uint)local_1080 & 0xfffffff);
    }
    auVar13._8_4_ = (int)(local_1080 >> 0x20);
    auVar13._0_8_ = local_1080;
    auVar13._12_4_ = 0x45300000;
    dStack_1090 = auVar13._8_8_ - 1.9342813113834067e+25;
    dVar15 = ((dStack_1090 + ((double)CONCAT44(0x43300000,(int)local_1080) - 4503599627370496.0)) /
             10000.0) / 60.0;
    if (local_1098._0_1_ == '1') {
      dVar15 = -dVar15;
      dStack_1090 = -dStack_1090;
    }
    local_10a8 = (double)CONCAT71(local_10a8._1_7_,*(undefined1 *)((long)local_10f8[0] + 0x59));
    local_1098 = dVar15;
    std::__cxx11::string::substr((ulong)local_10c8,(ulong)local_10f8);
    std::__cxx11::string::operator=((string *)&local_1138,(string *)local_10c8);
    if (local_10c8[0] != local_10b8) {
      operator_delete(local_10c8[0],local_10b8[0] + 1);
    }
    std::bitset<27ul>::bitset<char,std::char_traits<char>,std::allocator<char>>
              ((bitset<27ul> *)&local_1088,&local_1138,0);
    if (local_10a8._0_1_ == '1') {
      local_1088 = (ulong)(~(uint)local_1088 & 0x7ffffff);
    }
    auVar14._8_4_ = (int)(local_1088 >> 0x20);
    auVar14._0_8_ = local_1088;
    auVar14._12_4_ = 0x45300000;
    dStack_10a0 = auVar14._8_8_ - 1.9342813113834067e+25;
    dVar15 = ((dStack_10a0 + ((double)CONCAT44(0x43300000,(int)local_1088) - 4503599627370496.0)) /
             10000.0) / 60.0;
    if (local_10a8._0_1_ == '1') {
      dVar15 = -dVar15;
      dStack_10a0 = -dStack_10a0;
    }
    local_10a8 = dVar15;
    std::__cxx11::string::substr((ulong)local_10c8,(ulong)local_10f8);
    std::__cxx11::string::operator=((string *)&local_1138,(string *)local_10c8);
    if (local_10c8[0] != local_10b8) {
      operator_delete(local_10c8[0],local_10b8[0] + 1);
    }
    local_1018 = local_1008;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1018,local_1138._M_dataplus._M_p,
               local_1138._M_dataplus._M_p + local_1138._M_string_length);
    if ((int)local_1010 < 1) {
      local_10d8 = 0;
    }
    else {
      uVar2 = local_1010 & 0x7fffffff;
      uVar4 = 0;
      iVar8 = 0;
      do {
        local_1010 = local_1010 - 1;
        iVar8 = iVar8 + (*(char *)((long)local_1018 + uVar4) + -0x30 << ((byte)local_1010 & 0x1f));
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
      local_10d8 = (ulong)(uint)(iVar8 / 10);
    }
    if (local_1018 != local_1008) {
      operator_delete(local_1018,local_1008[0] + 1);
    }
    std::__cxx11::string::substr((ulong)local_10c8,(ulong)local_10f8);
    std::__cxx11::string::operator=((string *)&local_1138,(string *)local_10c8);
    if (local_10c8[0] != local_10b8) {
      operator_delete(local_10c8[0],local_10b8[0] + 1);
    }
    local_1038 = local_1028;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1038,local_1138._M_dataplus._M_p,
               local_1138._M_dataplus._M_p + local_1138._M_string_length);
    if ((int)local_1030 < 1) {
      iVar8 = 0;
    }
    else {
      uVar2 = local_1030 & 0x7fffffff;
      uVar4 = 0;
      iVar8 = 0;
      do {
        local_1030 = local_1030 - 1;
        iVar8 = iVar8 + (*(char *)((long)local_1038 + uVar4) + -0x30 << ((byte)local_1030 & 0x1f));
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
    if (local_1038 != local_1028) {
      operator_delete(local_1038,local_1028[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nmessage type = \t\t",0x12);
    std::ostream::operator<<((ostream *)&std::cout,iVar10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nrepeat indicator = \t",0x15);
    std::ostream::operator<<((ostream *)&std::cout,iVar6);
    lVar3 = *(long *)(std::cout + -0x18);
    if ((&DAT_0020e3f9)[lVar3] == '\0') {
      std::ios::widen((char)lVar3 + '\x18');
      (&DAT_0020e3f9)[lVar3] = 1;
    }
    fgets[lVar3] = (code)0x30;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nMMSI = \t\t\t",0xb);
    *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 9;
    std::ostream::operator<<((ostream *)&std::cout,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nnavagation status = \t",0x16);
    std::ostream::operator<<((ostream *)&std::cout,iVar11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nrate of turn = \t\t",0x12);
    std::ostream::operator<<((ostream *)&std::cout,iVar9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nspeed over ground = \t",0x16);
    std::ostream::operator<<((ostream *)&std::cout,(int)local_10d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nposition accuracy = \t",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_1118,local_1110);
    *(uint *)(fmod + *(long *)(std::cout + -0x18)) =
         *(uint *)(fmod + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nlongitude = \t\t",0xf);
    std::ostream::_M_insert<double>(local_1098);
    *(uint *)(fmod + *(long *)(std::cout + -0x18)) =
         *(uint *)(fmod + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nlatitude = \t\t",0xe);
    std::ostream::_M_insert<double>(local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\ncourse over ground = \t",0x17);
    std::ostream::operator<<((ostream *)&std::cout,(int)local_10d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\ntrue heading = \t\t",0x12);
    std::ostream::operator<<((ostream *)&std::cout,iVar8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
    *local_1078 = local_10a8;
    *local_1070 = local_1098;
    *local_1068 = (double)(int)local_10d0 / 1.94;
    *local_1060 = ((double)(int)local_10d8 * 3.141592653589793) / 180.0;
    if (local_1118 != local_1108) {
      operator_delete(local_1118,local_1108[0] + 1);
    }
    iVar6 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1138._M_dataplus._M_p != &local_1138.field_2) {
    operator_delete(local_1138._M_dataplus._M_p,local_1138.field_2._M_allocated_capacity + 1);
  }
  if (local_10f8[0] != local_10e8) {
    operator_delete(local_10f8[0],local_10e8[0] + 1);
  }
  if (local_1058 != local_1048) {
    operator_delete(local_1058,local_1048[0] + 1);
  }
  lVar3 = -0xf00;
  plVar12 = local_48;
  do {
    if (plVar12 != (long *)plVar12[-2]) {
      operator_delete((long *)plVar12[-2],*plVar12 + 1);
    }
    plVar12 = plVar12 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  return iVar6;
}

Assistant:

inline int decode_AIS(char* aisbuf, int aisbuflen, double* pAIS_Latitude, double* pAIS_Longitude, double* pAIS_SOG, double* pAIS_COG)
{	
	UNREFERENCED_PARAMETER(aisbuflen);

	// six bit ascii table. (gpsd.berlios.de/AIVDM)
	std::string six_bit_table[120];
	six_bit_table[48]="000000";
	six_bit_table[49]="000001";
	six_bit_table[50]="000010";
	six_bit_table[51]="000011";
	six_bit_table[52]="000100";
	six_bit_table[53]="000101";
	six_bit_table[54]="000110";
	six_bit_table[55]="000111";
	six_bit_table[56]="001000";
	six_bit_table[57]="001001";
	six_bit_table[58]="001010";
	six_bit_table[59]="001011";
	six_bit_table[60]="001100";
	six_bit_table[61]="001101";
	six_bit_table[62]="001110";
	six_bit_table[63]="001111";
	six_bit_table[64]="010000";
	six_bit_table[65]="010001";
	six_bit_table[66]="010010";
	six_bit_table[67]="010011";
	six_bit_table[68]="010100";
	six_bit_table[69]="010101";
	six_bit_table[70]="010110";
	six_bit_table[71]="010111";
	six_bit_table[72]="011000";
	six_bit_table[73]="011001";
	six_bit_table[74]="011010";
	six_bit_table[75]="011011";
	six_bit_table[76]="011100";
	six_bit_table[77]="011101";
	six_bit_table[78]="011110";
	six_bit_table[79]="011111";
	six_bit_table[80]="100000";
	six_bit_table[81]="100001";
	six_bit_table[82]="100010";
	six_bit_table[83]="100011";
	six_bit_table[84]="100100";
	six_bit_table[85]="100101";
	six_bit_table[86]="100110";
	six_bit_table[87]="100111";

	six_bit_table[96]="101000";
	six_bit_table[97]="101001";
	six_bit_table[98]="101010";
	six_bit_table[99]="101011";
	six_bit_table[100]="101100";
	six_bit_table[101]="101101";
	six_bit_table[102]="101110";
	six_bit_table[103]="101111";
	six_bit_table[104]="110000";
	six_bit_table[105]="110001";
	six_bit_table[106]="110010";
	six_bit_table[107]="110011";
	six_bit_table[108]="110100";
	six_bit_table[109]="110101";
	six_bit_table[110]="110110";
	six_bit_table[111]="110111";
	six_bit_table[112]="111000";
	six_bit_table[113]="111001";
	six_bit_table[114]="111010";
	six_bit_table[115]="111011";
	six_bit_table[116]="111100";
	six_bit_table[117]="111101";
	six_bit_table[118]="111110";
	six_bit_table[119]="111111";



	std::string six_bit=aisbuf;

	// convert 6 bit string to binary
	std::string ais_binary="";
	unsigned int x = 0;
	for (x=0; x<six_bit.length(); x++) {
		int z,y;
		z=six_bit[x];
		y=(x+1)*6-5;
		ais_binary.append(six_bit_table[z]);
		//std::cout<<z<<" "<<six_bit_table[z]<<" "<<y<<std::endl;
	}

	std::string temp_s=ais_binary.substr(0,6);
	//std::bitset<6> bb (temp_s);
	//int ais_message_type=bb.to_ulong();
	int ais_message_type=bin_to_int_AIS(temp_s);

	if ((ais_message_type < 1)||(ais_message_type > 3))
	{
		// Unhandled...
		return EXIT_FAILURE;
	}

	temp_s=ais_binary.substr(6,2);
	//std::bitset<2> cc (temp_s);
	//int ais_repeat_indicator=cc.to_ulong();
	int ais_repeat_indicator=bin_to_int_AIS(temp_s);

	temp_s=ais_binary.substr(8,30);
	//std::bitset<30> dd (temp_s);
	//int ais_mmsi=dd.to_ulong();
	int ais_mmsi=bin_to_int_AIS(temp_s);

	temp_s=ais_binary.substr(38,4);
	//std::bitset<4> ee(temp_s);
	//int ais_navigation_status=ee.to_ulong();
	int ais_navigation_status=bin_to_int_AIS(temp_s);

	temp_s=ais_binary.substr(42,8);
	//std::bitset<8> ff(temp_s);
	//int ais_rate_of_turn=ff.to_ulong();
	int ais_rate_of_turn=bin_to_int_AIS(temp_s);

	temp_s=ais_binary.substr(50,10);
	//std::bitset<10> gg(temp_s);
	//int ais_speed_over_ground=gg.to_ulong()/10;
	int ais_speed_over_ground=bin_to_int_AIS(temp_s)/10;

	std::string ais_position_accuracy=ais_binary.substr(60,1);

	char west=ais_binary[61];
	temp_s=ais_binary.substr(61,28);
	std::bitset<28> hh(temp_s);
	if (west=='1') {hh.flip();}
	double ais_longitude=hh.to_ulong();
	ais_longitude=ais_longitude/10000/60;
	if (west=='1') {ais_longitude *= -1;}


	char south=ais_binary[89];
	temp_s=ais_binary.substr(89,27);
	std::bitset<27> ii(temp_s);
	if (south=='1') {ii.flip();}
	double ais_latitude=ii.to_ulong();
	ais_latitude=ais_latitude/10000/60;
	if (south=='1') {ais_latitude *= -1;}


	temp_s=ais_binary.substr(116,12);
	//std::bitset<12> jj(temp_s);
	//int ais_course_over_ground=jj.to_ulong()/10;
	int ais_course_over_ground=bin_to_int_AIS(temp_s)/10;


	temp_s=ais_binary.substr(128,9);
	//std::bitset<9> kk(temp_s);
	//int ais_true_heading=kk.to_ulong();
	int ais_true_heading=bin_to_int_AIS(temp_s);

	std::cout<<"\nmessage type = \t\t"<<ais_message_type;
	std::cout<<"\nrepeat indicator = \t"<<ais_repeat_indicator;
	std::cout<< std::setfill('0')<< "\nMMSI = \t\t\t" << std::setw(9) <<ais_mmsi;
	std::cout<<"\nnavagation status = \t"<<ais_navigation_status;
	std::cout<<"\nrate of turn = \t\t"<<ais_rate_of_turn;
	std::cout<<"\nspeed over ground = \t"<<ais_speed_over_ground;
	std::cout<<"\nposition accuracy = \t"<<ais_position_accuracy;
	std::cout<< std::fixed << "\nlongitude = \t\t"<<ais_longitude;
	std::cout<< std::fixed << "\nlatitude = \t\t"<<ais_latitude;
	std::cout<<"\ncourse over ground = \t"<<ais_course_over_ground;
	std::cout<<"\ntrue heading = \t\t"<<ais_true_heading;
	std::cout<<std::endl;

	*pAIS_Latitude = ais_latitude;
	*pAIS_Longitude = ais_longitude;
	*pAIS_SOG = ais_speed_over_ground/1.94; // Convert to speed in m/s.
	*pAIS_COG = ais_course_over_ground*M_PI/180.0; // Convert to angle in rad.

	return EXIT_SUCCESS;
}